

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh_arch.cc
# Opt level: O0

void __thiscall SleighArchitecture::~SleighArchitecture(SleighArchitecture *this)

{
  SleighArchitecture *this_local;
  
  (this->super_Architecture).super_AddrSpaceManager._vptr_AddrSpaceManager =
       (_func_int **)&PTR__SleighArchitecture_00857f28;
  (this->super_Architecture).translate = (Translate *)0x0;
  std::__cxx11::string::~string((string *)&this->target);
  std::__cxx11::string::~string((string *)&this->filename);
  Architecture::~Architecture(&this->super_Architecture);
  return;
}

Assistant:

SleighArchitecture::~SleighArchitecture(void)

{
  translate = (const Translate *)0;
}